

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_histogram(REF_DBL *metric,REF_GRID ref_grid,char *filename)

{
  int iVar1;
  REF_NODE pRVar2;
  bool bVar3;
  uint uVar4;
  REF_INT *sorted_index;
  FILE *__s;
  long lVar5;
  REF_DBL *unaff_RBP;
  char *pcVar6;
  ulong uVar7;
  uint n;
  size_t __size;
  double dVar8;
  double dVar9;
  REF_DBL diag_system [12];
  double local_98;
  double local_90;
  double local_88;
  
  pRVar2 = ref_grid->node;
  iVar1 = pRVar2->n;
  if ((long)iVar1 < 0) {
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xc55,
           "ref_metric_histogram","malloc eig of REF_DBL negative");
    __size = 1;
  }
  else {
    __size = (long)iVar1 * 8;
    unaff_RBP = (REF_DBL *)malloc(__size);
    if (unaff_RBP == (REF_DBL *)0x0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xc55,"ref_metric_histogram","malloc eig of REF_DBL NULL");
      __size = 2;
      unaff_RBP = (REF_DBL *)0x0;
    }
    else {
      bVar3 = true;
      if (iVar1 != 0) {
        memset(unaff_RBP,0,__size);
      }
    }
  }
  uVar4 = (uint)__size;
  if (!bVar3) {
    return uVar4;
  }
  if ((long)pRVar2->n < 0) {
    uVar4 = 1;
    pcVar6 = "malloc sorted_index of REF_INT negative";
  }
  else {
    sorted_index = (REF_INT *)malloc((long)pRVar2->n << 2);
    if (sorted_index != (REF_INT *)0x0) {
      bVar3 = true;
      if (0 < pRVar2->n) {
        lVar5 = 0;
        do {
          sorted_index[lVar5] = -1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < pRVar2->n);
      }
      goto LAB_001c2138;
    }
    uVar4 = 2;
    pcVar6 = "malloc sorted_index of REF_INT NULL";
  }
  sorted_index = (REF_INT *)0x0;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xc56,
         "ref_metric_histogram",pcVar6);
  bVar3 = false;
LAB_001c2138:
  if (bVar3) {
    if (pRVar2->max < 1) {
      n = 0;
    }
    else {
      lVar5 = 0;
      n = 0;
      do {
        if (-1 < pRVar2->global[lVar5]) {
          uVar4 = ref_matrix_diag_m(metric,&local_98);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xc59,"ref_metric_histogram",(ulong)uVar4,"decomp");
            return uVar4;
          }
          dVar8 = local_98;
          if (local_98 <= -local_98) {
            dVar8 = -local_98;
          }
          dVar9 = local_90;
          if (local_90 <= -local_90) {
            dVar9 = -local_90;
          }
          if (dVar8 <= dVar9) {
            dVar8 = dVar9;
          }
          dVar9 = local_88;
          if (local_88 <= -local_88) {
            dVar9 = -local_88;
          }
          if (dVar8 <= dVar9) {
            dVar8 = dVar9;
          }
          unaff_RBP[(int)n] = dVar8;
          n = n + 1;
        }
        lVar5 = lVar5 + 1;
        metric = metric + 6;
      } while (lVar5 < pRVar2->max);
    }
    if (pRVar2->n == n) {
      uVar4 = ref_sort_heap_dbl(n,unaff_RBP,sorted_index);
      if (uVar4 == 0) {
        __s = fopen(filename,"w");
        if (__s == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xc64,"ref_metric_histogram","unable to open file");
          uVar4 = 2;
        }
        else {
          fwrite("title=\"tecplot ordered max eig\"\n",0x20,1,__s);
          fwrite("variables = \"i\" \"e\"\n",0x14,1,__s);
          fwrite("zone t=\"eig\"\n",0xd,1,__s);
          if (0 < (int)n) {
            uVar7 = 0;
            do {
              fprintf(__s,"%d %e\n",unaff_RBP[sorted_index[uVar7]],uVar7 & 0xffffffff);
              uVar7 = uVar7 + 1;
            } while (n != uVar7);
          }
          fclose(__s);
          if (sorted_index != (REF_INT *)0x0) {
            free(sorted_index);
          }
          uVar4 = 0;
          if (unaff_RBP != (REF_DBL *)0x0) {
            free(unaff_RBP);
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xc60,"ref_metric_histogram",(ulong)uVar4,"sort");
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xc5f,"ref_metric_histogram","node count",(long)pRVar2->n,(long)(int)n);
      uVar4 = 1;
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_histogram(REF_DBL *metric, REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *eig, diag_system[12];
  REF_INT i, node, n, *sorted_index;
  FILE *file;

  ref_malloc_init(eig, ref_node_n(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sorted_index, ref_node_n(ref_node), REF_INT, REF_EMPTY);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
    eig[n] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                     ABS(ref_matrix_eig(diag_system, 1))),
                 ABS(ref_matrix_eig(diag_system, 2)));
    n++;
  }
  REIS(ref_node_n(ref_node), n, "node count");
  RSS(ref_sort_heap_dbl(n, eig, sorted_index), "sort");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot ordered max eig\"\n");
  fprintf(file, "variables = \"i\" \"e\"\n");
  fprintf(file, "zone t=\"eig\"\n");
  for (i = 0; i < n; i++) {
    fprintf(file, "%d %e\n", i, eig[sorted_index[i]]);
  }
  fclose(file);
  ref_free(sorted_index);
  ref_free(eig);
  return REF_SUCCESS;
}